

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableStatement<tcu::Matrix<float,_3,_2>_>::doExecute
          (VariableStatement<tcu::Matrix<float,_3,_2>_> *this,EvalContext *ctx)

{
  Environment *this_00;
  Variable<tcu::Matrix<float,_3,_2>_> *variable;
  Expr<tcu::Matrix<float,_3,_2>_> *pEVar1;
  IVal *this_01;
  IVal local_b0;
  
  if (this->m_isDeclaration == true) {
    this_00 = ctx->env;
    variable = (this->m_variable).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
               .m_ptr;
    pEVar1 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_3,_2>_>.
             super_ExprPBase<tcu::Matrix<float,_3,_2>_>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr;
    (*(pEVar1->super_ExprBase)._vptr_ExprBase[4])(&local_b0,pEVar1,ctx);
    Environment::bind<tcu::Matrix<float,3,2>>(this_00,variable,&local_b0);
  }
  else {
    pEVar1 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_3,_2>_>.
             super_ExprPBase<tcu::Matrix<float,_3,_2>_>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr;
    (*(pEVar1->super_ExprBase)._vptr_ExprBase[4])(&local_b0,pEVar1,ctx);
    this_01 = Environment::lookup<tcu::Matrix<float,3,2>>
                        (ctx->env,(this->m_variable).
                                  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                                  .m_ptr);
    tcu::Matrix<tcu::Interval,_3,_2>::operator=(this_01,&local_b0);
  }
  return;
}

Assistant:

void			doExecute			(EvalContext& ctx)						const
	{
		if (m_isDeclaration)
			ctx.env.bind(*m_variable, m_value->evaluate(ctx));
		else
			ctx.env.lookup(*m_variable) = m_value->evaluate(ctx);
	}